

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void __thiscall
Js::JavascriptArray::CreateDataPropertyOrThrow
          (JavascriptArray *this,RecyclableObject *obj,BigIndex index,Var item,
          ScriptContext *scriptContext)

{
  undefined1 uVar1;
  bool bVar2;
  uint uVar3;
  JavascriptArray *arr;
  undefined8 uVar4;
  Var aItem;
  BigIndex index_00;
  undefined1 local_60 [8];
  BigIndex index_local;
  JsReentLock jsReentLock;
  
  uVar4 = index._0_8_;
  local_60._0_4_ = SUB84(obj,0);
  index_local.bigIndex = *(uint64 *)((long)item + 0x3b8);
  uVar1 = *(undefined1 *)(index_local.bigIndex + 0x108);
  *(undefined1 *)(index_local.bigIndex + 0x108) = 1;
  aItem = item;
  index_local._0_8_ = uVar4;
  bVar2 = IsNonES5Array(this);
  if (bVar2) {
    arr = UnsafeVarTo<Js::JavascriptArray>(this);
  }
  else {
    arr = (JavascriptArray *)0x0;
  }
  if (arr == (JavascriptArray *)0x0) {
    *(undefined1 *)(index_local.bigIndex + 0x108) = uVar1;
    uVar3 = SetArrayLikeObjects(this,(RecyclableObject *)((ulong)obj & 0xffffffff),index,aItem);
    index_00.bigIndex = (uint64)aItem;
    index_00.index = (uint32)uVar4;
    index_00._4_4_ = SUB84(uVar4,4);
    ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar3,(BOOL)item,
                        (ScriptContext *)((ulong)obj & 0xffffffff),index_00);
    JsReentLock::MutateArrayObject((JsReentLock *)&index_local.bigIndex);
    *(undefined1 *)(index_local.bigIndex + 0x108) = 1;
  }
  else {
    BigIndex::SetItem((BigIndex *)local_60,arr,(Var)index.bigIndex);
  }
  *(undefined1 *)(index_local.bigIndex + 0x108) = uVar1;
  return;
}

Assistant:

void JavascriptArray::CreateDataPropertyOrThrow(RecyclableObject * obj, BigIndex index, Var item, ScriptContext * scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        JavascriptArray * arr = JavascriptArray::TryVarToNonES5Array(obj);
        if (arr != nullptr)
        {
            arr->GenericDirectSetItemAt(index, item);
        }
        else
        {
            JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(SetArrayLikeObjects(obj, index, item), scriptContext, index));
        }
    }